

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_cond_timedwait(uv_cond_t *cond,uv_mutex_t *mutex,uint64_t timeout)

{
  uint64_t uVar1;
  undefined1 local_40 [8];
  timespec ts;
  int r;
  uint64_t timeout_local;
  uv_mutex_t *mutex_local;
  uv_cond_t *cond_local;
  
  uVar1 = uv__hrtime(UV_CLOCK_PRECISE);
  local_40 = (undefined1  [8])((uVar1 + timeout) / 1000000000);
  ts.tv_sec = (uVar1 + timeout) % 1000000000;
  ts.tv_nsec._4_4_ =
       pthread_cond_timedwait((pthread_cond_t *)cond,(pthread_mutex_t *)mutex,(timespec *)local_40);
  if (ts.tv_nsec._4_4_ == 0) {
    cond_local._4_4_ = 0;
  }
  else {
    if (ts.tv_nsec._4_4_ != 0x6e) {
      abort();
    }
    cond_local._4_4_ = -0x6e;
  }
  return cond_local._4_4_;
}

Assistant:

int uv_cond_timedwait(uv_cond_t* cond, uv_mutex_t* mutex, uint64_t timeout) {
  int r;
  struct timespec ts;
#if defined(__MVS__)
  struct timeval tv;
#endif

#if defined(__APPLE__) && defined(__MACH__)
  ts.tv_sec = timeout / NANOSEC;
  ts.tv_nsec = timeout % NANOSEC;
  r = pthread_cond_timedwait_relative_np(cond, mutex, &ts);
#else
#if defined(__MVS__)
  if (gettimeofday(&tv, NULL))
    abort();
  timeout += tv.tv_sec * NANOSEC + tv.tv_usec * 1e3;
#else
  timeout += uv__hrtime(UV_CLOCK_PRECISE);
#endif
  ts.tv_sec = timeout / NANOSEC;
  ts.tv_nsec = timeout % NANOSEC;
  r = pthread_cond_timedwait(cond, mutex, &ts);
#endif


  if (r == 0)
    return 0;

  if (r == ETIMEDOUT)
    return UV_ETIMEDOUT;

  abort();
#ifndef __SUNPRO_C
  return UV_EINVAL;  /* Satisfy the compiler. */
#endif
}